

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O1

ValueType ValueType::FromObject(RecyclableObject *recyclableObject)

{
  Bits bits;
  TypeId typeId;
  code *pcVar1;
  bool bVar2;
  ObjectType OVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar4;
  undefined4 *puVar5;
  ulong uVar6;
  anon_union_2_4_ea848c7b_for_ValueType_13 unaff_R15W;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a [2];
  ValueType valueType_1;
  ValueType valueType;
  
  if (recyclableObject == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x543,"(recyclableObject)","recyclableObject");
    if (!bVar2) goto LAB_00b22690;
    *puVar5 = 0;
  }
  typeId = ((recyclableObject->type).ptr)->typeId;
  uVar6 = (ulong)typeId;
  if (uVar6 < 0x58) {
    bits = TypeIdToBits[uVar6];
    if (bits != 0) {
      ValueType((ValueType *)&local_2c.field_0,bits);
      Verify((ValueType)local_2c.field_0);
      local_2a[0].field_0 = local_2c.field_0;
      bVar2 = IsLikelyOptimizedTypedArray((ValueType *)&local_2a[0].field_0);
      unaff_R15W = local_2c;
      if ((bVar2) &&
         ((recyclableObject->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject == (_func_int **)TypeIdToVtable[uVar6])) {
        OVar3 = GetObjectType((ValueType *)&local_2a[0].field_0);
        unaff_R15W.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             GetObject(VirtualTypedArrayPair[OVar3]);
      }
    }
    if (bits != 0) {
      return (ValueType)unaff_R15W.bits;
    }
  }
  bVar2 = Js::DynamicType::Is(typeId);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x553,"(DynamicType::Is(typeId))","DynamicType::Is(typeId)");
    if (!bVar2) {
LAB_00b22690:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = Js::JavascriptArray::IsNonES5Array(typeId);
  if (bVar2) {
    aVar4.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         FromArray(Array,(JavascriptArray *)recyclableObject,typeId);
  }
  else if (((recyclableObject->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject ==
            (_func_int **)VirtualTableInfo<Js::DynamicObject>::Address) &&
          (bVar2 = Js::DynamicObject::HasObjectArray((DynamicObject *)recyclableObject), bVar2)) {
    aVar4.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         FromObjectWithArray((DynamicObject *)recyclableObject);
  }
  else {
    local_2e.bits = Object;
    SetObjectType((ValueType *)&local_2e.field_0,Object);
    aVar4 = local_2e;
    Verify((ValueType)local_2e.field_0);
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)aVar4.field_0;
}

Assistant:

ValueType ValueType::FromObject(Js::RecyclableObject *const recyclableObject)
{
    using namespace Js;
    Assert(recyclableObject);
    const TypeId typeId = recyclableObject->GetTypeId();
    if (typeId < _countof(TypeIdToBits))
    {
        const Bits bits = TypeIdToBits[typeId];
        if (!!bits)
        {
            const ValueType valueType = Verify(bits);
            if (!valueType.IsLikelyOptimizedTypedArray())
                return valueType;
            bool isVirtual = (VirtualTableInfoBase::GetVirtualTable(recyclableObject) == ValueType::GetVirtualTypedArrayVtable(typeId));
            if (!isVirtual)
                return valueType;
            return GetObject(VirtualTypedArrayPair[static_cast<uint16>(valueType.GetObjectType())]);
        }
    }
    Assert(DynamicType::Is(typeId)); // all static type IDs have nonzero values in TypeIdToBits

    if(!JavascriptArray::IsNonES5Array(typeId))
    {
        // TODO: Once the issue with loop bodies and uninitialized interpreter local slots is fixed, use FromVar
        DynamicObject *const object = static_cast<DynamicObject *>(recyclableObject);
        if(!VirtualTableInfo<DynamicObject>::HasVirtualTable(object) || !object->HasObjectArray())
            return GetObject(ObjectType::Object);
        return FromObjectWithArray(object);
    }

    return FromArray(ObjectType::Array, static_cast<JavascriptArray *>(recyclableObject), typeId);
}